

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O1

void __kmp_api_omp_set_nested(int flag)

{
  kmp_info_t *thread;
  kmp_taskdata_t *pkVar1;
  int iVar2;
  int iVar3;
  kmp_msg_t local_28;
  
  __kmp_msg_format(&local_28,0x4010e,"omp_set_nested","omp_set_max_active_levels");
  __kmp_msg(kmp_ms_inform);
  iVar2 = __kmp_get_global_thread_id_reg();
  thread = __kmp_threads[iVar2];
  __kmp_save_internal_controls(thread);
  pkVar1 = (thread->th).th_current_task;
  iVar2 = (pkVar1->td_icvs).max_active_levels;
  iVar3 = 0x7fffffff;
  if (iVar2 != 1) {
    iVar3 = iVar2;
  }
  iVar2 = 1;
  if (flag != 0) {
    iVar2 = iVar3;
  }
  (pkVar1->td_icvs).max_active_levels = iVar2;
  return;
}

Assistant:

void FTN_STDCALL KMP_EXPAND_NAME(FTN_SET_NESTED)(int KMP_DEREF flag) {
  KMP_INFORM(APIDeprecated, "omp_set_nested", "omp_set_max_active_levels");
#ifdef KMP_STUB
  __kmps_set_nested(KMP_DEREF flag);
#else
  kmp_info_t *thread;
  /* For the thread-private internal controls implementation */
  thread = __kmp_entry_thread();
  __kmp_save_internal_controls(thread);
  // Somewhat arbitrarily decide where to get a value for max_active_levels
  int max_active_levels = get__max_active_levels(thread);
  if (max_active_levels == 1)
    max_active_levels = KMP_MAX_ACTIVE_LEVELS_LIMIT;
  set__max_active_levels(thread, (KMP_DEREF flag) ? max_active_levels : 1);
#endif
}